

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,
          UnicodeString *ruleSetName,Locale *localeParam)

{
  LocalizationInfo *pLVar1;
  uint uVar2;
  char16_t *pcVar3;
  undefined1 local_68 [4];
  int32_t ix;
  UnicodeString rsn;
  Locale *localeParam_local;
  UnicodeString *ruleSetName_local;
  RuleBasedNumberFormat *this_local;
  UnicodeString *bogus;
  
  rsn.fUnion._48_8_ = localeParam;
  if (this->localizations == (LocalizationInfo *)0x0) {
    icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
    icu_63::UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_68,ruleSetName);
    pLVar1 = this->localizations;
    pcVar3 = icu_63::UnicodeString::getTerminatedBuffer((UnicodeString *)local_68);
    uVar2 = (*pLVar1->_vptr_LocalizationInfo[9])(pLVar1,pcVar3);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x2a])
              (__return_storage_ptr__,this,(ulong)uVar2,rsn.fUnion._48_8_);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString 
RuleBasedNumberFormat::getRuleSetDisplayName(const UnicodeString& ruleSetName, const Locale& localeParam) {
    if (localizations) {
        UnicodeString rsn(ruleSetName);
        int32_t ix = localizations->indexForRuleSet(rsn.getTerminatedBuffer());
        return getRuleSetDisplayName(ix, localeParam);
    }
    UnicodeString bogus;
    bogus.setToBogus();
    return bogus;
}